

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkSupport(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  Abc_NtkIncrementTravId(pNtk);
  p = Vec_PtrAlloc(100);
  for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar3);
    Abc_NtkNodeSupport_rec((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],p);
  }
  for (iVar3 = 0; iVar1 = pNtk->vCis->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar3);
    iVar1 = Abc_NodeIsTravIdCurrent(pAVar2);
    if (iVar1 == 0) {
      Vec_PtrPush(p,pAVar2);
    }
  }
  if (p->nSize == iVar1) {
    return p;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                ,0x36b,"Vec_Ptr_t *Abc_NtkSupport(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkSupport( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkNodeSupport_rec( Abc_ObjFanin0(pNode), vNodes );
    // add unused CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        if ( !Abc_NodeIsTravIdCurrent( pNode ) )
            Vec_PtrPush( vNodes, pNode );
    assert( Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk) );
    return vNodes;
}